

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-optimizer-common.hpp
# Opt level: O0

void __thiscall
baryonyx::itm::storage<baryonyx::itm::default_cost_type<double>,_baryonyx::itm::minimize_tag>::
show_population(storage<baryonyx::itm::default_cost_type<double>,_baryonyx::itm::minimize_tag> *this
               ,context *ctx)

{
  context *ctx_00;
  const_reference arg1;
  const_reference pvVar1;
  const_reference pvVar2;
  const_reference pvVar3;
  const_reference pvVar4;
  int local_24;
  size_type sStack_20;
  int i;
  context *local_18;
  context *ctx_local;
  storage<baryonyx::itm::default_cost_type<double>,_baryonyx::itm::minimize_tag> *this_local;
  
  local_18 = ctx;
  ctx_local = (context *)this;
  sStack_20 = std::vector<int,_std::allocator<int>_>::size(&this->m_indices);
  info<unsigned_long>(ctx," Population {}:\n",&stack0xffffffffffffffe0);
  for (local_24 = 0; ctx_00 = local_18, local_24 != this->m_size; local_24 = local_24 + 1) {
    arg1 = std::vector<int,_std::allocator<int>_>::operator[](&this->m_indices,(long)local_24);
    pvVar1 = std::vector<int,_std::allocator<int>_>::operator[](&this->m_indices,(long)local_24);
    pvVar2 = std::
             vector<baryonyx::raw_result<baryonyx::itm::minimize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::minimize_tag>_>_>
             ::operator[](&this->m_data,(long)*pvVar1);
    pvVar1 = std::vector<int,_std::allocator<int>_>::operator[](&this->m_indices,(long)local_24);
    pvVar3 = std::
             vector<baryonyx::raw_result<baryonyx::itm::minimize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::minimize_tag>_>_>
             ::operator[](&this->m_data,(long)*pvVar1);
    pvVar1 = std::vector<int,_std::allocator<int>_>::operator[](&this->m_indices,(long)local_24);
    pvVar4 = std::
             vector<baryonyx::raw_result<baryonyx::itm::minimize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::minimize_tag>_>_>
             ::operator[](&this->m_data,(long)*pvVar1);
    info<int,double,int,unsigned_long>
              (ctx_00,"  - {}: value {} constraints {} hash {}\n",arg1,&pvVar2->value,
               &pvVar3->remaining_constraints,&pvVar4->hash);
  }
  return;
}

Assistant:

void show_population(const context& ctx) const
    {
        info(ctx, " Population {}:\n", m_indices.size());
        for (int i = 0; i != m_size; ++i)
            info(ctx,
                 "  - {}: value {} constraints {} hash {}\n",
                 m_indices[i],
                 m_data[m_indices[i]].value,
                 m_data[m_indices[i]].remaining_constraints,
                 m_data[m_indices[i]].hash);
    }